

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
          (void *this,Symbol *a,Symbol *b)

{
  bool bVar1;
  string_view __x;
  string_view __y;
  
  __x = Symbol::full_name((Symbol *)this);
  __y = Symbol::full_name(a);
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.full_name() == b.full_name();
  }